

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_api.cpp
# Opt level: O0

void long_running_query(Connection *conn,bool *correct)

{
  byte bVar1;
  byte *in_RSI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  allocator local_39;
  string local_38 [32];
  string local_18 [8];
  byte *local_10;
  
  *in_RSI = 1;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,
             "SELECT i1.i FROM integers i1, integers i2, integers i3, integers i4, integers i5, integers i6, integers i7, integers i8, integers i9, integers i10,integers i11, integers i12, integers i13"
             ,&local_39);
  duckdb::Connection::Query(local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar1 = duckdb::BaseQueryResult::HasError();
  *local_10 = bVar1 & 1;
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x53205a);
  return;
}

Assistant:

static void long_running_query(Connection *conn, bool *correct) {
	*correct = true;
	auto result = conn->Query("SELECT i1.i FROM integers i1, integers i2, integers i3, integers i4, integers i5, "
	                          "integers i6, integers i7, integers i8, integers i9, integers i10,"
	                          "integers i11, integers i12, integers i13");
	// the query should fail
	*correct = result->HasError();
}